

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

ssize_t __thiscall AutoFile::write(AutoFile *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  Span<const_std::byte> key;
  Span<std::byte> write;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  byte *pbVar7;
  error_code *this_00;
  long *plVar8;
  long in_FS_OFFSET;
  Span<const_std::byte> *in_stack_ffffffffffffee78;
  array<std::byte,_4096UL> *in_stack_ffffffffffffee80;
  io_errc __e;
  error_code *in_stack_ffffffffffffee88;
  byte *in_stack_ffffffffffffee90;
  error_code *peVar9;
  byte *in_stack_ffffffffffffee98;
  byte *in_stack_ffffffffffffeec0;
  size_t in_stack_ffffffffffffeec8;
  byte *in_stack_ffffffffffffeed0;
  size_t in_stack_ffffffffffffeed8;
  AutoFile *this_local;
  Span<std::byte> buf_now;
  Span<const_std::byte> src_local;
  array<std::byte,_4096UL> buf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_file == (FILE *)0x0) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffee88,(io_errc)((ulong)in_stack_ffffffffffffee80 >> 0x20));
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)"AutoFile::write: file handle is nullptr");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    bVar2 = std::vector<std::byte,_std::allocator<std::byte>_>::empty
                      ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee88);
    if (bVar2) {
      pbVar7 = Span<const_std::byte>::data(in_stack_ffffffffffffee78);
      __e = (io_errc)((ulong)in_stack_ffffffffffffee80 >> 0x20);
      sVar6 = Span<const_std::byte>::size(in_stack_ffffffffffffee78);
      sVar4 = fwrite(pbVar7,1,sVar6,(FILE *)this->m_file);
      sVar6 = Span<const_std::byte>::size(in_stack_ffffffffffffee78);
      if (sVar4 != sVar6) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        std::error_code::error_code<std::io_errc,void>(in_stack_ffffffffffffee88,__e);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"AutoFile::write: write failed");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_01b1ccf1;
      }
      bVar2 = std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffee78);
      if (bVar2) {
        sVar6 = Span<const_std::byte>::size(in_stack_ffffffffffffee78);
        plVar8 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffee78);
        *plVar8 = sVar6 + *plVar8;
      }
    }
    else {
      bVar2 = std::optional<long>::has_value((optional<long> *)in_stack_ffffffffffffee78);
      if (!bVar2) {
        pcVar5 = (char *)__cxa_allocate_exception(0x20);
        pcVar3 = pcVar5;
        std::error_code::error_code<std::io_errc,void>
                  (in_stack_ffffffffffffee88,(io_errc)((ulong)in_stack_ffffffffffffee80 >> 0x20));
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"AutoFile::write: position unknown");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_01b1ccf1;
      }
      while (sVar6 = Span<const_std::byte>::size(in_stack_ffffffffffffee78), sVar6 != 0) {
        Span<std::byte>::Span<std::array<std::byte,4096ul>>
                  ((Span<std::byte> *)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,
                   in_stack_ffffffffffffee78);
        Span<const_std::byte>::size(in_stack_ffffffffffffee78);
        std::array<std::byte,_4096UL>::size((array<std::byte,_4096UL> *)in_stack_ffffffffffffee78);
        std::min<unsigned_long>
                  ((unsigned_long *)in_stack_ffffffffffffee80,
                   (unsigned_long *)in_stack_ffffffffffffee78);
        Span<std::byte>::first
                  ((Span<std::byte> *)in_stack_ffffffffffffee88,(size_t)in_stack_ffffffffffffee80);
        Span<const_std::byte>::begin(in_stack_ffffffffffffee78);
        pbVar7 = Span<const_std::byte>::begin(in_stack_ffffffffffffee78);
        Span<std::byte>::size((Span<std::byte> *)in_stack_ffffffffffffee78);
        Span<std::byte>::begin((Span<std::byte> *)in_stack_ffffffffffffee78);
        std::copy<std::byte_const*,std::byte*>
                  (in_stack_ffffffffffffee98,in_stack_ffffffffffffee90,
                   (byte *)in_stack_ffffffffffffee88);
        Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<const_std::byte> *)in_stack_ffffffffffffee88,
                   (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffee80,
                   in_stack_ffffffffffffee78);
        std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffee78);
        write.m_size = in_stack_ffffffffffffeed8;
        write.m_data = in_stack_ffffffffffffeed0;
        key.m_size = in_stack_ffffffffffffeec8;
        key.m_data = in_stack_ffffffffffffeec0;
        util::Xor(write,key,(size_t)pbVar7);
        pbVar7 = Span<std::byte>::data((Span<std::byte> *)in_stack_ffffffffffffee78);
        sVar6 = Span<std::byte>::size((Span<std::byte> *)in_stack_ffffffffffffee78);
        in_stack_ffffffffffffeec0 = (byte *)fwrite(pbVar7,1,sVar6,(FILE *)this->m_file);
        pbVar7 = (byte *)Span<std::byte>::size((Span<std::byte> *)in_stack_ffffffffffffee78);
        if (in_stack_ffffffffffffeec0 != pbVar7) {
          this_00 = (error_code *)__cxa_allocate_exception(0x20);
          peVar9 = this_00;
          std::error_code::error_code<std::io_errc,void>
                    (this_00,(io_errc)((ulong)in_stack_ffffffffffffee80 >> 0x20));
          std::ios_base::failure[abi:cxx11]::failure
                    ((char *)peVar9,(error_code *)"XorFile::write: failed");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_01b1ccf1;
        }
        Span<std::byte>::size((Span<std::byte> *)in_stack_ffffffffffffee78);
        Span<const_std::byte>::subspan
                  ((Span<const_std::byte> *)in_stack_ffffffffffffee88,
                   (size_t)in_stack_ffffffffffffee80);
        in_stack_ffffffffffffee80 =
             (array<std::byte,_4096UL> *)
             Span<std::byte>::size((Span<std::byte> *)in_stack_ffffffffffffee78);
        plVar8 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffee78);
        *plVar8 = (long)(in_stack_ffffffffffffee80->_M_elems + *plVar8);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
LAB_01b1ccf1:
  __stack_chk_fail();
}

Assistant:

void AutoFile::write(Span<const std::byte> src)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::write: file handle is nullptr");
    if (m_xor.empty()) {
        if (std::fwrite(src.data(), 1, src.size(), m_file) != src.size()) {
            throw std::ios_base::failure("AutoFile::write: write failed");
        }
        if (m_position.has_value()) *m_position += src.size();
    } else {
        if (!m_position.has_value()) throw std::ios_base::failure("AutoFile::write: position unknown");
        std::array<std::byte, 4096> buf;
        while (src.size() > 0) {
            auto buf_now{Span{buf}.first(std::min<size_t>(src.size(), buf.size()))};
            std::copy(src.begin(), src.begin() + buf_now.size(), buf_now.begin());
            util::Xor(buf_now, m_xor, *m_position);
            if (std::fwrite(buf_now.data(), 1, buf_now.size(), m_file) != buf_now.size()) {
                throw std::ios_base::failure{"XorFile::write: failed"};
            }
            src = src.subspan(buf_now.size());
            *m_position += buf_now.size();
        }
    }
}